

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O1

void TTD::NSSnapValues::ExtractSnapFunctionBodyScopeChain
               (bool isWellKnownFunction,SnapFunctionBodyScopeChain *scopeChain,FunctionBody *fb,
               SlabAllocator *alloc)

{
  uint uVar1;
  ScopeObjectChain *pSVar2;
  unsigned_long *puVar3;
  Type *pTVar4;
  undefined7 in_register_00000039;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this;
  long lVar5;
  
  scopeChain->ScopeCount = 0;
  scopeChain->ScopeArray = (TTD_PTR_ID *)0x0;
  if (((int)CONCAT71(in_register_00000039,isWellKnownFunction) == 0) &&
     (pSVar2 = Js::FunctionBody::GetScopeObjectChain(fb), pSVar2 != (ScopeObjectChain *)0x0)) {
    pSVar2 = Js::FunctionBody::GetScopeObjectChain(fb);
    uVar1 = (((pSVar2->pScopeChain).ptr)->
            super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).count;
    scopeChain->ScopeCount = uVar1;
    if ((ulong)uVar1 == 0) {
      scopeChain->ScopeArray = (TTD_PTR_ID *)0x0;
    }
    else {
      puVar3 = SlabAllocatorBase<0>::SlabAllocateArray<unsigned_long>(alloc,(ulong)uVar1);
      scopeChain->ScopeArray = puVar3;
      this = (pSVar2->pScopeChain).ptr;
      if (0 < (this->super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).
              count) {
        lVar5 = 0;
        do {
          pTVar4 = JsUtil::
                   List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   ::Item(this,(int)lVar5);
          scopeChain->ScopeArray[lVar5] = (TTD_PTR_ID)pTVar4->ptr;
          lVar5 = lVar5 + 1;
          this = (pSVar2->pScopeChain).ptr;
        } while (lVar5 < (this->
                         super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>)
                         .count);
      }
    }
  }
  return;
}

Assistant:

void ExtractSnapFunctionBodyScopeChain(bool isWellKnownFunction, SnapFunctionBodyScopeChain& scopeChain, Js::FunctionBody* fb, SlabAllocator& alloc)
        {
            scopeChain.ScopeCount = 0;
            scopeChain.ScopeArray = nullptr;

            if(!isWellKnownFunction && fb->GetScopeObjectChain() != nullptr)
            {
                Js::ScopeObjectChain* scChain = fb->GetScopeObjectChain();
                scopeChain.ScopeCount = (uint32)scChain->pScopeChain->Count();

                if(scopeChain.ScopeCount == 0)
                {
                    scopeChain.ScopeArray = nullptr;
                }
                else
                {
                    scopeChain.ScopeArray = alloc.SlabAllocateArray<TTD_PTR_ID>(scopeChain.ScopeCount);

                    for(int32 i = 0; i < scChain->pScopeChain->Count(); ++i)
                    {
                        Js::DebuggerScope* dbgScope = scChain->pScopeChain->Item(i);
                        scopeChain.ScopeArray[i] = TTD_CONVERT_DEBUGSCOPE_TO_PTR_ID(dbgScope);
                    }
                }
            }
        }